

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_pdf(double x,double mu,double sigma)

{
  double dVar1;
  double dVar2;
  double y;
  double r8_pi;
  double pdf;
  double sigma_local;
  double mu_local;
  double x_local;
  
  dVar1 = (x - mu) / sigma;
  dVar1 = exp(dVar1 * -0.5 * dVar1);
  dVar2 = sqrt(sigma * 6.283185307179586 * sigma);
  return dVar1 / dVar2;
}

Assistant:

double normal_pdf ( double x, double mu, double sigma )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_PDF evaluates the Normal PDF.
//
//  Discussion:
//
//    PDF(X;MU,SIGMA)
//      = exp ( - 0.5 * ( ( X - MU ) / SIGMAB )^2 )
//      / SQRT ( 2 * PI * SIGMA^2 )
//
//    The normal PDF is also known as the Gaussian PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    19 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double MU, SIGMA, the mean and standard deviation.
//    SIGMA should not be zero.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf;
  const double r8_pi = 3.14159265358979323;
  double y;

  y = ( x - mu ) / sigma;

  pdf = exp ( - 0.5 * y * y )  / sqrt ( 2.0 * r8_pi * sigma * sigma );

  return pdf;
}